

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O1

int envy_bios_parse_conn(envy_bios *bios)

{
  uint8_t uVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  envy_bios_conn_entry *peVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  envy_bios *peVar14;
  char *__format;
  uint uVar15;
  byte bVar16;
  int iVar17;
  int *piVar18;
  uint8_t bytes [4];
  byte local_44 [4];
  envy_bios *local_40;
  ulong local_38;
  
  uVar3 = (bios->conn).offset;
  iVar17 = 0;
  if (uVar3 != 0) {
    local_40 = bios;
    if ((uint)uVar3 < bios->length) {
      (bios->conn).version = bios->data[(uint)uVar3];
      iVar17 = 0;
    }
    else {
      (bios->conn).version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar17 = -0xe;
    }
    lVar9 = (ulong)(local_40->conn).offset + 1;
    if ((uint)lVar9 < local_40->length) {
      (local_40->conn).hlen = local_40->data[lVar9];
      iVar10 = 0;
    }
    else {
      (local_40->conn).hlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar10 = -0xe;
    }
    lVar9 = (ulong)(local_40->conn).offset + 2;
    if ((uint)lVar9 < local_40->length) {
      (local_40->conn).entriesnum = local_40->data[lVar9];
      iVar4 = 0;
    }
    else {
      (local_40->conn).entriesnum = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar4 = -0xe;
    }
    lVar9 = (ulong)(local_40->conn).offset + 3;
    if ((uint)lVar9 < local_40->length) {
      (local_40->conn).rlen = local_40->data[lVar9];
      iVar5 = 0;
    }
    else {
      (local_40->conn).rlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar5 = -0xe;
    }
    if (((iVar10 == 0 && iVar17 == 0) && iVar4 == 0) && iVar5 == 0) {
      envy_bios_block(local_40,(uint)(local_40->conn).offset,
                      (uint)(local_40->conn).entriesnum * (uint)(local_40->conn).rlen +
                      (uint)(local_40->conn).hlen,"CONN",-1);
      bVar16 = (local_40->conn).rlen;
      uVar1 = (local_40->conn).version;
      if ((uVar1 == '0') || (uVar1 == '@')) {
        bVar2 = (local_40->conn).hlen;
        uVar13 = (ulong)bVar2;
        if (bVar2 < 5) {
          __format = "CONN table header too short [%d < %d]\n";
          uVar8 = 5;
        }
        else {
          uVar12 = (uint)(3 < bVar16) * 2 + 2;
          if (uVar12 < bVar16 || uVar12 == bVar16) {
            if (bVar2 != 5) {
              fprintf(_stderr,"CONN table header longer than expected [%d > %d]\n",uVar13,5);
            }
            bVar16 = (local_40->conn).rlen;
            if (uVar12 < bVar16) {
              fprintf(_stderr,"CONN table record longer than expected [%d > %d]\n",(ulong)bVar16,
                      (ulong)uVar12);
            }
            peVar7 = (envy_bios_conn_entry *)calloc((ulong)(local_40->conn).entriesnum,10);
            (local_40->conn).entries = peVar7;
            if (peVar7 == (envy_bios_conn_entry *)0x0) {
              return -0xc;
            }
            peVar14 = local_40;
            if ((local_40->conn).entriesnum != '\0') {
              local_38 = 0;
              uVar12 = 0;
              do {
                peVar7 = (peVar14->conn).entries + local_38;
                peVar7->offset =
                     (ushort)(peVar14->conn).rlen * (short)local_38 +
                     (ushort)(peVar14->conn).hlen + (peVar14->conn).offset;
                local_44[0] = 0;
                local_44[1] = 0;
                local_44[2] = 0;
                local_44[3] = 0;
                peVar7->hpd = -1;
                peVar7->dp_ext = -1;
                bVar16 = 0;
                uVar13 = 0;
                uVar11 = 0;
                do {
                  uVar15 = uVar12;
                  if ((peVar14->conn).rlen <= uVar13) break;
                  if ((uint)peVar7->offset + (int)uVar13 < peVar14->length) {
                    local_44[uVar13] = peVar14->data[uVar13 + peVar7->offset];
                    uVar6 = 0;
                  }
                  else {
                    local_44[uVar13] = 0;
                    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                    uVar6 = 0xfffffff2;
                    peVar14 = local_40;
                  }
                  uVar15 = 0;
                  uVar12 = uVar6 | uVar12;
                  if (uVar12 != 0) goto LAB_0025abff;
                  uVar11 = uVar11 | (uint)local_44[uVar13] << (bVar16 & 0x1f);
                  uVar13 = uVar13 + 1;
                  bVar16 = bVar16 + 8;
                  uVar12 = 0;
                } while (uVar13 != 4);
                uVar13 = local_38;
                peVar7->type = local_44[0];
                peVar7->tag = local_44[1] & 0xf;
                piVar18 = envy_bios_parse_conn::hpds;
                lVar9 = 0;
                do {
                  if ((uVar11 >> (*piVar18 & 0x1fU) & 1) != 0) {
                    if (peVar7->hpd == -1) {
                      peVar7->hpd = (int8_t)lVar9;
                    }
                    else {
                      fprintf(_stderr,"CONN %d: duplicate HPD bits\n",uVar13 & 0xffffffff);
                      peVar14 = local_40;
                    }
                  }
                  lVar9 = lVar9 + 1;
                  piVar18 = (int *)((uint *)piVar18 + 1);
                } while (lVar9 != 7);
                iVar17 = 0;
                do {
                  if (((uVar11 >> ((byte)iVar17 & 0x1f)) >> 0xe & 1) != 0) {
                    if (peVar7->dp_ext == -1) {
                      peVar7->dp_ext = (byte)iVar17;
                    }
                    else {
                      fprintf(_stderr,"CONN %d: duplicate DP_AUX bits\n",uVar13 & 0xffffffff);
                      peVar14 = local_40;
                    }
                  }
                  iVar17 = iVar17 + 1;
                } while (iVar17 == 1);
                peVar7->unk02_2 = local_44[2] >> 2 & 3;
                peVar7->unk02_4 = local_44[2] >> 4 & 7;
                peVar7->unk02_7 = local_44[2] >> 7;
                peVar7->unk03_3 = local_44[3] >> 3;
                local_38 = uVar13;
                uVar12 = uVar15;
                uVar15 = 1;
LAB_0025abff:
                if ((char)uVar15 == '\0') goto LAB_0025a95a;
                local_38 = local_38 + 1;
              } while (local_38 < (peVar14->conn).entriesnum);
            }
            (peVar14->conn).valid = '\x01';
            return 0;
          }
          __format = "CONN table record too short [%d < %d]\n";
          uVar13 = (ulong)(uint)bVar16;
          uVar8 = (ulong)uVar12;
        }
        fprintf(_stderr,__format,uVar13,uVar8);
      }
      else {
        envy_bios_parse_conn_cold_1();
      }
      iVar17 = -0x16;
    }
    else {
LAB_0025a95a:
      iVar17 = -0xe;
    }
  }
  return iVar17;
}

Assistant:

int envy_bios_parse_conn (struct envy_bios *bios) {
	struct envy_bios_conn *conn = &bios->conn;
	if (!conn->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, conn->offset, &conn->version);
	err |= bios_u8(bios, conn->offset+1, &conn->hlen);
	err |= bios_u8(bios, conn->offset+2, &conn->entriesnum);
	err |= bios_u8(bios, conn->offset+3, &conn->rlen);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, conn->offset, conn->hlen + conn->rlen * conn->entriesnum, "CONN", -1);
	int wanthlen = 5;
	int wantrlen = 4;
	if (conn->rlen < 4)
		wantrlen = 2;
	switch (conn->version) {
		case 0x30:
		case 0x40:
			break;
		default:
			ENVY_BIOS_ERR("Unknown CONN table version %d.%d\n", conn->version >> 4, conn->version & 0xf);
			return -EINVAL;
	}
	if (conn->hlen < wanthlen) {
		ENVY_BIOS_ERR("CONN table header too short [%d < %d]\n", conn->hlen, wanthlen);
		return -EINVAL;
	}
	if (conn->rlen < wantrlen) {
		ENVY_BIOS_ERR("CONN table record too short [%d < %d]\n", conn->rlen, wantrlen);
		return -EINVAL;
	}
	if (conn->hlen > wanthlen) {
		ENVY_BIOS_WARN("CONN table header longer than expected [%d > %d]\n", conn->hlen, wanthlen);
	}
	if (conn->rlen > wantrlen) {
		ENVY_BIOS_WARN("CONN table record longer than expected [%d > %d]\n", conn->rlen, wantrlen);
	}
	conn->entries = calloc(conn->entriesnum, sizeof *conn->entries);
	if (!conn->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < conn->entriesnum; i++) {
		struct envy_bios_conn_entry *entry = &conn->entries[i];
		entry->offset = conn->offset + conn->hlen + conn->rlen * i;
		uint8_t bytes[4] = { 0 };
		uint32_t val = 0;
		int j;
		static const int hpds[7] = { 12, 13, 16, 17, 24, 25, 26 };
		entry->hpd = -1;
		entry->dp_ext = -1;
		for (j = 0; j < 4 && j < conn->rlen; j++) {
			err |= bios_u8(bios, entry->offset+j, &bytes[j]);
			if (err)
				return -EFAULT;
			val |= bytes[j] << j * 8;
		}
		entry->type = bytes[0];
		entry->tag = bytes[1] & 0xf;
		for (j = 0; j < 7; j++) {
			if (val & 1 << hpds[j]) {
				if (entry->hpd == -1)
					entry->hpd = j;
				else
					ENVY_BIOS_ERR("CONN %d: duplicate HPD bits\n", i);
			}
		}
		for (j = 0; j < 2; j++) {
			if (val & 1 << (j+14)) {
				if (entry->dp_ext == -1)
					entry->dp_ext = j;
				else
					ENVY_BIOS_ERR("CONN %d: duplicate DP_AUX bits\n", i);
			}
		}
		entry->unk02_2 = bytes[2] >> 2 & 3;
		entry->unk02_4 = bytes[2] >> 4 & 7;
		entry->unk02_7 = bytes[2] >> 7 & 1;
		entry->unk03_3 = bytes[3] >> 3 & 0x1f;
	}
	conn->valid = 1;
	return 0;
}